

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wifi_debug_ostream.h
# Opt level: O2

void __thiscall WifiDebugOstream::onechar(WifiDebugOstream *this,char c)

{
  char cVar1;
  char c_local;
  
  c_local = c;
  (**this->m_serialDebug->_vptr_DebugInterface)(this->m_serialDebug,&c_local,1);
  cVar1 = c_local;
  if (this->m_lastWasNewline == true && c_local != '\n') {
    operator<<(this->m_wifiDebug,"# ");
  }
  (*this->m_wifiDebug->_vptr_NetInterface[4])(this->m_wifiDebug,&c_local,1);
  this->m_lastWasNewline = cVar1 == '\n';
  return;
}

Assistant:

void onechar(char c )
  { 
    m_serialDebug->write( &c, 1 );
    bool isNewLine = ( c == '\n' );
    if ( m_lastWasNewline && !isNewLine )
    {
      (*m_wifiDebug) << "# ";
    }
    m_wifiDebug->write( &c, 1 );
    m_lastWasNewline = isNewLine;
  }